

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateValueFunctionWrapper
          (ExpressionContext *ctx,SynBase *source,SynBase *synValue,ExprBase *exprValue,
          InplaceStr functionName)

{
  uint uniqueId;
  Allocator *pAVar1;
  ScopeData *scope;
  TypeFunction *pTVar2;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<MatchData> generics;
  TypeRef *contextType;
  bool bVar3;
  TypeBase *pTVar4;
  SynIdentifier *pSVar5;
  FunctionData *pFVar6;
  SynBase *pSVar7;
  ExprBase *pEVar8;
  ExprReturn *this;
  ExprFunctionDefinition *this_00;
  char *pcVar9;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr name;
  TypeBase *local_798;
  ExprBase *access;
  IntrusiveList<ExprVariableDefinition> local_720;
  ExprVariableDefinition *local_710;
  ExprVariableDefinition *contextVariableDefinition;
  VariableData *contextVariable;
  IntrusiveList<ExprBase> expressions;
  ExprVariableDefinition *contextArgumentDefinition;
  IntrusiveList<MatchData> local_6d8;
  FunctionData *local_6c8;
  FunctionData *function;
  undefined4 local_6b8;
  TypeFunction *local_6b0;
  TypeFunction *typeFunction;
  char *pcStack_6a0;
  SynIdentifier *local_690;
  SynIdentifier *functionNameIdentifier;
  char *pcStack_680;
  TypeRef *local_668;
  TypeBase *contextRefType;
  SmallArray<ArgumentData,_32U> arguments;
  ExprBase *exprValue_local;
  SynBase *synValue_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr functionName_local;
  
  arguments.allocator = (Allocator *)exprValue;
  bVar3 = AssertValueExpression(ctx,source,exprValue);
  if (bVar3) {
    SmallArray<ArgumentData,_32U>::SmallArray
              ((SmallArray<ArgumentData,_32U> *)&contextRefType,ctx->allocator);
    local_668 = (TypeRef *)0x0;
    if ((ctx->scope == ctx->globalScope) || (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) {
      local_668 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    }
    else {
      functionNameIdentifier = (SynIdentifier *)functionName.begin;
      pcStack_680 = functionName.end;
      pTVar4 = CreateFunctionContextType(ctx,source,functionName);
      local_668 = ExpressionContext::GetReferenceType(ctx,pTVar4);
    }
    pSVar5 = ExpressionContext::get<SynIdentifier>(ctx);
    typeFunction = (TypeFunction *)functionName.begin;
    pcStack_6a0 = functionName.end;
    SynIdentifier::SynIdentifier(pSVar5,source->begin,source->end,functionName);
    if (arguments.allocator == (Allocator *)0x0) {
      local_798 = ctx->typeAuto;
    }
    else {
      local_798 = (TypeBase *)arguments.allocator[3]._vptr_Allocator;
    }
    local_690 = pSVar5;
    ArrayView<ArgumentData>::ArrayView<32u>
              ((ArrayView<ArgumentData> *)&function,(SmallArray<ArgumentData,_32U> *)&contextRefType
              );
    arguments_01._12_4_ = 0;
    arguments_01.data = (ArgumentData *)function;
    arguments_01.count = local_6b8;
    local_6b0 = ExpressionContext::GetFunctionType(ctx,source,local_798,arguments_01);
    pFVar6 = ExpressionContext::get<FunctionData>(ctx);
    contextType = local_668;
    pSVar5 = local_690;
    pTVar2 = local_6b0;
    pAVar1 = ctx->allocator;
    scope = ctx->scope;
    IntrusiveList<MatchData>::IntrusiveList(&local_6d8);
    uniqueId = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uniqueId + 1;
    pcVar9 = (char *)0x0;
    generics.tail = local_6d8.tail;
    generics.head = local_6d8.head;
    FunctionData::FunctionData
              (pFVar6,pAVar1,source,scope,false,false,false,pTVar2,&contextType->super_TypeBase,
               pSVar5,generics,uniqueId);
    name.end = pcVar9;
    name.begin = (pFVar6->name->name).end;
    local_6c8 = pFVar6;
    anon_unknown.dwarf_6f1cc::CheckFunctionConflict
              ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)source,
               (SynBase *)(pFVar6->name->name).begin,name);
    ExpressionContext::AddFunction(ctx,local_6c8);
    ExpressionContext::PushScope(ctx,local_6c8);
    local_6c8->functionScope = ctx->scope;
    pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    expressions.tail = &CreateFunctionContextArgument(ctx,pSVar7,local_6c8)->super_ExprBase;
    local_6c8->argumentsSize = local_6c8->functionScope->dataSize;
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&contextVariable);
    if (synValue == (SynBase *)0x0) {
      this = ExpressionContext::get<ExprReturn>(ctx);
      pAVar1 = arguments.allocator;
      pTVar4 = ctx->typeVoid;
      pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pEVar8 = CreateFunctionUpvalueClose(ctx,pSVar7,local_6c8,ctx->scope);
      ExprReturn::ExprReturn(this,source,pTVar4,(ExprBase *)pAVar1,(ExprBase *)0x0,pEVar8);
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)&contextVariable,&this->super_ExprBase);
    }
    else {
      pEVar8 = AnalyzeExpression(ctx,synValue);
      pEVar8 = CreateReturn(ctx,source,pEVar8);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&contextVariable,pEVar8);
    }
    ClosePendingUpvalues(ctx,local_6c8);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
    contextVariableDefinition = (ExprVariableDefinition *)0x0;
    local_710 = (ExprVariableDefinition *)0x0;
    if ((ctx->scope != ctx->globalScope) && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)) {
      contextVariableDefinition =
           (ExprVariableDefinition *)
           CreateFunctionContextVariable(ctx,source,local_6c8,(FunctionData *)0x0);
      local_710 = CreateFunctionContextVariableDefinition
                            (ctx,source,local_6c8,(FunctionData *)0x0,
                             (VariableData *)contextVariableDefinition);
    }
    this_00 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
    pFVar6 = local_6c8;
    pEVar8 = expressions.tail;
    pTVar2 = local_6c8->type;
    IntrusiveList<ExprVariableDefinition>::IntrusiveList(&local_720);
    arguments_00.tail = local_720.tail;
    arguments_00.head = local_720.head;
    expressions_00.tail = expressions.head;
    expressions_00.head = (ExprBase *)contextVariable;
    ExprFunctionDefinition::ExprFunctionDefinition
              (this_00,source,&pTVar2->super_TypeBase,pFVar6,(ExprVariableDefinition *)pEVar8,
               arguments_00,(ExprBase *)0x0,expressions_00,local_710,
               (VariableData *)contextVariableDefinition);
    local_6c8->declaration = &this_00->super_ExprBase;
    SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_6c8->declaration);
    functionName_local.end = (char *)ExpressionContext::get<ExprFunctionAccess>(ctx);
    pFVar6 = local_6c8;
    pTVar2 = local_6c8->type;
    pSVar7 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar8 = CreateFunctionContextAccess(ctx,pSVar7,local_6c8);
    ExprFunctionAccess::ExprFunctionAccess
              ((ExprFunctionAccess *)functionName_local.end,source,&pTVar2->super_TypeBase,pFVar6,
               pEVar8);
    if (local_710 != (ExprVariableDefinition *)0x0) {
      functionName_local.end =
           (char *)CreateSequence(ctx,source,&local_710->super_ExprBase,
                                  (ExprBase *)functionName_local.end);
    }
    SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&contextRefType);
  }
  else {
    functionName_local.end = (char *)ExpressionContext::get<ExprError>(ctx);
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              ((ExprError *)functionName_local.end,source,pTVar4,(ExprBase *)arguments.allocator);
  }
  return (ExprBase *)functionName_local.end;
}

Assistant:

ExprBase* CreateValueFunctionWrapper(ExpressionContext &ctx, SynBase *source, SynBase *synValue, ExprBase *exprValue, InplaceStr functionName)
{
	if(!AssertValueExpression(ctx, source, exprValue))
		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType(), exprValue);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextRefType = NULL;

	if(ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace)
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(source->begin, source->end, functionName);

	TypeFunction *typeFunction = ctx.GetFunctionType(source, exprValue ? exprValue->type : ctx.typeAuto, arguments);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, typeFunction, contextRefType, functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	IntrusiveList<ExprBase> expressions;

	if (synValue)
		expressions.push_back(CreateReturn(ctx, source, AnalyzeExpression(ctx, synValue)));
	else
		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, exprValue, NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(ctx.scope != ctx.globalScope && !ctx.scope->ownerNamespace)
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, function->type, function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), function));

	if(!contextVariableDefinition)
		return access;

	return CreateSequence(ctx, source, contextVariableDefinition, access);
}